

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O2

int yang_read_deviate_unique(lys_deviate *deviate,lys_node *dev_target)

{
  lys_ext_instance **pplVar1;
  LY_ERR *pLVar2;
  
  if (dev_target->nodetype == LYS_LIST) {
    if (deviate->mod != LY_DEVIATE_ADD) {
      return 0;
    }
    pplVar1 = (lys_ext_instance **)
              ly_realloc(dev_target[1].ext,
                         (ulong)(((uint)dev_target->padding[3] + (uint)deviate->unique_size) * 0x10)
                        );
    if (pplVar1 != (lys_ext_instance **)0x0) {
      dev_target[1].ext = pplVar1;
      memset(pplVar1 + (ulong)dev_target->padding[3] * 2,0,(ulong)deviate->unique_size << 4);
      return 0;
    }
    pLVar2 = ly_errno_location();
    *pLVar2 = LY_EMEM;
    ly_log(LY_LLERR,"Memory allocation failed (%s()).","yang_read_deviate_unique");
  }
  else {
    ly_vlog(LYE_INSTMT,LY_VLOG_NONE,(void *)0x0,"unique");
    ly_vlog(LYE_SPEC,LY_VLOG_NONE,(void *)0x0,"Target node does not allow \"unique\" property.");
  }
  return 1;
}

Assistant:

int
yang_read_deviate_unique(struct lys_deviate *deviate, struct lys_node *dev_target)
{
    struct lys_node_list *list;
    struct lys_unique *unique;

    /* check target node type */
    if (dev_target->nodetype != LYS_LIST) {
        LOGVAL(LYE_INSTMT, LY_VLOG_NONE, NULL, "unique");
        LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL, "Target node does not allow \"unique\" property.");
        goto error;
    }

    list = (struct lys_node_list *)dev_target;
    if (deviate->mod == LY_DEVIATE_ADD) {
        /* reallocate the unique array of the target */
        unique = ly_realloc(list->unique, (deviate->unique_size + list->unique_size) * sizeof *unique);
        if (!unique) {
            LOGMEM;
            goto error;
        }
        list->unique = unique;
        memset(unique + list->unique_size, 0, deviate->unique_size * sizeof *unique);
    }

    return EXIT_SUCCESS;

error:
    return EXIT_FAILURE;
}